

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void av1_lowbd_inv_txfm2d_add_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  uint uVar1;
  undefined1 in_CL;
  undefined4 in_EDX;
  int32_t *in_RSI;
  byte in_R8B;
  int in_R9D;
  int in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffe8;
  
  uVar1 = (uint)in_R8B;
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      lowbd_inv_txfm2d_add_8x8_avx2
                (in_RSI,(uint8_t *)
                        CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
                 in_R9D,'\0','\0',in_stack_ffffffffffffffdc);
      return;
    }
    if ((uVar1 - 2 < 3) || ((3 < uVar1 - 5 && ((uVar1 - 9 < 4 || (3 < uVar1 - 0xd)))))) {
      lowbd_inv_txfm2d_add_universe_avx2
                (in_RSI,(uint8_t *)
                        CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
                 in_R9D,'\0','\0',in_stack_ffffffffffffffdc);
      return;
    }
  }
  av1_lowbd_inv_txfm2d_add_ssse3
            (in_RSI,(uint8_t *)
                    CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
             in_R9D,'\0','\0',in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_avx2(const int32_t *input, uint8_t *output,
                                   int stride, TX_TYPE tx_type, TX_SIZE tx_size,
                                   int eob) {
  switch (tx_size) {
    case TX_4X4:
    case TX_4X8:
    case TX_8X4:
    case TX_8X16:
    case TX_16X8:
    case TX_4X16:
    case TX_16X4:
    case TX_8X32:
    case TX_32X8:
      av1_lowbd_inv_txfm2d_add_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X8:
      lowbd_inv_txfm2d_add_8x8_avx2(input, output, stride, tx_type, tx_size,
                                    eob);
      break;
    case TX_16X16:
    case TX_32X32:
    case TX_64X64:
    case TX_16X32:
    case TX_32X16:
    case TX_32X64:
    case TX_64X32:
    case TX_16X64:
    case TX_64X16:
    default:
      lowbd_inv_txfm2d_add_universe_avx2(input, output, stride, tx_type,
                                         tx_size, eob);
      break;
  }
}